

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O1

string * removeIUPAC(string *sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  uint uVar4;
  ulong uVar5;
  string *in_RDI;
  byte bVar6;
  
  uVar4 = (uint)sequence->_M_string_length;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pcVar2 = (sequence->_M_dataplus)._M_p;
      bVar6 = pcVar2[uVar5] + 0xbe;
      if ((bVar6 < 0x18) && ((0xb31a45U >> (bVar6 & 0x1f) & 1) != 0)) {
        pcVar2[uVar5] = (&DAT_0012dbbb)[bVar6];
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  pcVar2 = (sequence->_M_dataplus)._M_p;
  paVar1 = &sequence->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&sequence->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar3;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar2;
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = sequence->_M_string_length;
  (sequence->_M_dataplus)._M_p = (pointer)paVar1;
  sequence->_M_string_length = 0;
  (sequence->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

std::string removeIUPAC(std::string sequence){
    int n = sequence.length();
    for(int i = 0; i<n; ++i){
        if(sequence[i] == 'R') sequence[i] = 'G';
        else if(sequence[i] == 'Y') sequence[i] = 'C';
        else if (sequence[i] == 'S') sequence[i] = 'G';
        else if (sequence[i] == 'W') sequence[i] = 'A';
        else if (sequence[i] == 'K') sequence[i] = 'T';
        else if (sequence[i] == 'M') sequence[i] = 'A';
        else if (sequence[i] == 'B') sequence[i] = 'C';
        else if (sequence[i] == 'D') sequence[i] = 'T';
        else if (sequence[i] == 'H') sequence[i] = 'A';
        else if (sequence[i] == 'V') sequence[i] = 'G';
        else if (sequence[i] == 'N') sequence[i] = 'A';

    }
    return sequence;
}